

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_linux.cc
# Opt level: O1

void __thiscall rcdiscover::SocketLinux::bindImpl(SocketLinux *this,sockaddr_in *addr)

{
  int iVar1;
  SocketException *this_00;
  int *piVar2;
  string local_40;
  
  iVar1 = bind(this->sock_,(sockaddr *)addr,0x10);
  if (iVar1 != -1) {
    return;
  }
  this_00 = (SocketException *)__cxa_allocate_exception(0x38);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Error while binding to socket","");
  piVar2 = __errno_location();
  SocketException::SocketException(this_00,&local_40,*piVar2);
  __cxa_throw(this_00,&SocketException::typeinfo,SocketException::~SocketException);
}

Assistant:

void SocketLinux::bindImpl(const ::sockaddr_in& addr)
{
  if (::bind(sock_,
             reinterpret_cast<const sockaddr *>(&addr),
             sizeof(sockaddr)) == -1)
  {
    throw SocketException("Error while binding to socket", errno);
  }
}